

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

bool __thiscall BanMan::IsBanned(BanMan *this,CNetAddr *net_addr)

{
  long lVar1;
  bool bVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  reference ppVar3;
  long in_FS_OFFSET;
  pair<const_CSubNet,_CBanEntry> *it;
  banmap_t *__range1;
  int64_t current_time;
  CBanEntry ban_entry;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  CSubNet sub_net;
  CSubNet *in_stack_ffffffffffffff28;
  CSubNet *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CSubNet *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff60;
  byte local_79;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (UniqueLock<AnnotatedMixin<std::mutex>_> *)GetTime();
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             SUB41((uint)in_stack_ffffffffffffff48 >> 0x18,0));
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::begin((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
           *)in_stack_ffffffffffffff30);
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::end((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
         *)in_stack_ffffffffffffff30);
  while (bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff3f,
                                                   CONCAT16(in_stack_ffffffffffffff3e,
                                                            in_stack_ffffffffffffff38)),
                                 (_Self *)in_stack_ffffffffffffff30), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
                        in_stack_ffffffffffffff28);
    CSubNet::CSubNet((CSubNet *)
                     CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                     in_stack_ffffffffffffff30);
    if (((long)this_00 < (ppVar3->second).nBanUntil) &&
       (in_stack_ffffffffffffff3f =
             CSubNet::Match(in_stack_ffffffffffffff50,
                            (CNetAddr *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
       (bool)in_stack_ffffffffffffff3f)) {
      local_79 = 1;
      in_stack_ffffffffffffff48 = 1;
    }
    else {
      in_stack_ffffffffffffff48 = 0;
    }
    CSubNet::~CSubNet(in_stack_ffffffffffffff28);
    if (in_stack_ffffffffffffff48 != 0) goto LAB_008b1932;
    std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)in_stack_ffffffffffffff28)
    ;
  }
  local_79 = 0;
LAB_008b1932:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_79 & 1);
}

Assistant:

bool BanMan::IsBanned(const CNetAddr& net_addr)
{
    auto current_time = GetTime();
    LOCK(m_banned_mutex);
    for (const auto& it : m_banned) {
        CSubNet sub_net = it.first;
        CBanEntry ban_entry = it.second;

        if (current_time < ban_entry.nBanUntil && sub_net.Match(net_addr)) {
            return true;
        }
    }
    return false;
}